

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

int __thiscall el::base::RegisteredLoggers::remove(RegisteredLoggers *this,char *__filename)

{
  bool bVar1;
  undefined7 extraout_var;
  Logger *logger;
  Logger *local_20;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __filename,"default");
  if (!bVar1) {
    local_20 = utils::
               Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get(&this->
                      super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __filename);
    if (local_20 != (Logger *)0x0) {
      unregister(this,&local_20);
    }
  }
  return (uint)CONCAT71(extraout_var,bVar1) ^ 1;
}

Assistant:

bool RegisteredLoggers::remove(const std::string& id) {
  if (id == base::consts::kDefaultLoggerId) {
    return false;
  }
  // get has internal lock
  Logger* logger = base::utils::Registry<Logger, std::string>::get(id);
  if (logger != nullptr) {
    // unregister has internal lock
    unregister(logger);
  }
  return true;
}